

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecompiler.cpp
# Opt level: O0

CCFunc * __thiscall asmjit::CodeCompiler::addFunc(CodeCompiler *this,CCFunc *func)

{
  CBNode *pCVar1;
  CCFunc *in_RSI;
  CodeBuilder *in_RDI;
  CBNode *cursor;
  char *in_stack_000003b0;
  int in_stack_000003bc;
  char *in_stack_000003c0;
  CodeBuilder *this_00;
  
  if (in_RDI[1].super_CodeEmitter._vptr_CodeEmitter != (_func_int **)0x0) {
    DebugUtils::assertionFailed(in_stack_000003c0,in_stack_000003bc,in_stack_000003b0);
  }
  in_RDI[1].super_CodeEmitter._vptr_CodeEmitter = (_func_int **)in_RSI;
  this_00 = in_RDI;
  CodeBuilder::addNode(in_RDI,(CBNode *)in_RSI);
  pCVar1 = in_RDI->_cursor;
  CodeBuilder::addNode(this_00,(CBNode *)in_RSI);
  CodeBuilder::addNode(this_00,(CBNode *)in_RSI);
  in_RDI->_cursor = pCVar1;
  return in_RSI;
}

Assistant:

CCFunc* CodeCompiler::addFunc(CCFunc* func) {
  ASMJIT_ASSERT(_func == nullptr);
  _func = func;

  addNode(func);                 // Function node.
  CBNode* cursor = getCursor();  // {CURSOR}.
  addNode(func->getExitNode());  // Function exit label.
  addNode(func->getEnd());       // Function end marker.

  _setCursor(cursor);
  return func;
}